

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void vdbeFreeOpArray(sqlite3 *db,Op *aOp,int nOp)

{
  Op *pOVar1;
  
  if ((aOp != (Op *)0x0) && (0 < nOp)) {
    pOVar1 = aOp;
    do {
      freeP4(db,(int)pOVar1->p4type,(pOVar1->p4).p);
      pOVar1 = pOVar1 + 1;
    } while (pOVar1 < aOp + nOp);
  }
  sqlite3DbFree(db,aOp);
  return;
}

Assistant:

static void vdbeFreeOpArray(sqlite3 *db, Op *aOp, int nOp){
  if( aOp ){
    Op *pOp;
    for(pOp=aOp; pOp<&aOp[nOp]; pOp++){
      freeP4(db, pOp->p4type, pOp->p4.p);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
      sqlite3DbFree(db, pOp->zComment);
#endif     
    }
  }
  sqlite3DbFree(db, aOp);
}